

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmInstallTargetGenerator::Compute(cmInstallTargetGenerator *this,cmLocalGenerator *lg)

{
  cmGeneratorTarget *pcVar1;
  
  pcVar1 = cmLocalGenerator::FindLocalNonAliasGeneratorTarget(lg,&this->TargetName);
  this->Target = pcVar1;
  if (pcVar1 == (cmGeneratorTarget *)0x0) {
    pcVar1 = cmGlobalGenerator::FindGeneratorTarget(lg->GlobalGenerator,&this->TargetName);
    this->Target = pcVar1;
  }
  return;
}

Assistant:

void cmInstallTargetGenerator::Compute(cmLocalGenerator* lg)
{
  // Lookup this target in the current directory.
  this->Target = lg->FindLocalNonAliasGeneratorTarget(this->TargetName);
  if (!this->Target) {
    // If no local target has been found, find it in the global scope.
    this->Target =
      lg->GetGlobalGenerator()->FindGeneratorTarget(this->TargetName);
  }
}